

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O0

bool __thiscall QDataWidgetMapperPrivate::commit(QDataWidgetMapperPrivate *this,WidgetMapper *m)

{
  long *plVar1;
  bool bVar2;
  ulong uVar3;
  QWidget *pQVar4;
  long in_RDI;
  long in_FS_OFFSET;
  QModelIndex idx;
  bool local_41;
  QPersistentModelIndex local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QPointer<QWidget>::isNull((QPointer<QWidget> *)0x87006a);
  if (bVar2) {
    local_41 = true;
  }
  else {
    uVar3 = QPersistentModelIndex::isValid();
    if ((uVar3 & 1) == 0) {
      local_41 = false;
    }
    else {
      local_40.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_40);
      bVar2 = QByteArray::isEmpty((QByteArray *)0x8700db);
      if (bVar2) {
        plVar1 = *(long **)(in_RDI + 0x80);
        pQVar4 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x8700fc);
        (**(code **)(*plVar1 + 0x88))(plVar1,pQVar4,*(undefined8 *)(in_RDI + 0x78),&local_40);
      }
      else {
        plVar1 = *(long **)(in_RDI + 0x78);
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x870135);
        QByteArray::operator_cast_to_char_((QByteArray *)0x870148);
        QObject::property((char *)&local_28);
        (**(code **)(*plVar1 + 0x98))(plVar1,&local_40,&local_28,2);
        ::QVariant::~QVariant(&local_28);
      }
      local_41 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_41;
  }
  __stack_chk_fail();
}

Assistant:

bool QDataWidgetMapperPrivate::commit(const WidgetMapper &m)
{
    if (m.widget.isNull())
        return true; // just ignore

    if (!m.currentIndex.isValid())
        return false;

    // Create copy to avoid passing the widget mappers data
    QModelIndex idx = m.currentIndex;
    if (m.property.isEmpty())
        delegate->setModelData(m.widget, model, idx);
    else
        model->setData(idx, m.widget->property(m.property), Qt::EditRole);

    return true;
}